

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Tag TVar4;
  uint uVar5;
  intptr_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  Nonnull<const_char_*> pcVar17;
  MessageLite *pMVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  
  pcVar17 = (Nonnull<const_char_*>)0x0;
  uVar19 = (ulong)mem % (ulong)this->alignment_;
  if (uVar19 != 0) {
    pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                        (uVar19,0,"reinterpret_cast<uintptr_t>(mem) % alignment_ == 0u");
  }
  if (pcVar17 == (Nonnull<const_char_*>)0x0) {
    TVar4 = this->tag_;
    if ((long)TVar4 < 0) {
      pMVar18 = (MessageLite *)(*(this->field_3).func_)(prototype_for_func,mem,arena);
      return pMVar18;
    }
    uVar5 = this->allocation_size_;
    uVar19 = (ulong)uVar5;
    if (TVar4 == kZeroInit) {
      pcVar14 = std::
                __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>>
                          (prototype_for_copy + 1);
      if (pcVar14 == (char *)((long)&prototype_for_copy->_vptr_MessageLite + uVar19)) {
        if (uVar5 < 0x21) {
          uVar21 = 0;
          uVar22 = 0;
          uVar23 = 0;
          uVar24 = 0;
LAB_00226b42:
          puVar1 = (undefined4 *)((long)mem + (uVar19 - 0x10));
          *puVar1 = uVar21;
          puVar1[1] = uVar22;
          puVar1[2] = uVar23;
          puVar1[3] = uVar24;
        }
        else {
          if (uVar5 < 0x41) {
            uVar21 = 0;
            uVar22 = 0;
            uVar23 = 0;
            uVar24 = 0;
            *(undefined8 *)((long)mem + 0x10) = 0;
            *(undefined8 *)((long)mem + 0x18) = 0;
            puVar3 = (undefined8 *)((long)mem + (uVar19 - 0x10));
            *puVar3 = 0;
            puVar3[1] = 0;
            goto LAB_00226b89;
          }
          if (0x50 < uVar5) {
            lVar15 = (long)mem + 0x50;
            uVar16 = 0x50;
            do {
              *(undefined8 *)(lVar15 + -0x10) = 0;
              *(undefined8 *)(lVar15 + -8) = 0;
              *(undefined8 *)(lVar15 + -0x20) = 0;
              *(undefined8 *)(lVar15 + -0x18) = 0;
              *(undefined8 *)(lVar15 + -0x30) = 0;
              *(undefined8 *)(lVar15 + -0x28) = 0;
              *(undefined8 *)(lVar15 + -0x40) = 0;
              *(undefined8 *)(lVar15 + -0x38) = 0;
              uVar16 = uVar16 + 0x40;
              lVar15 = lVar15 + 0x40;
            } while (uVar16 < uVar19);
          }
          uVar21 = 0;
          uVar22 = 0;
          uVar23 = 0;
          uVar24 = 0;
          puVar3 = (undefined8 *)((long)mem + (uVar19 - 0x10));
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)mem + (uVar19 - 0x20));
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)mem + (uVar19 - 0x30));
          *puVar3 = 0;
          puVar3[1] = 0;
LAB_00226c53:
          puVar1 = (undefined4 *)((long)mem + (uVar19 - 0x40));
          *puVar1 = uVar21;
          puVar1[1] = uVar22;
          puVar1[2] = uVar23;
          puVar1[3] = uVar24;
        }
        goto LAB_00226c59;
      }
      PlacementNew<false,google::protobuf::MessageLite>();
LAB_00226d47:
      PlacementNew<false,google::protobuf::MessageLite>();
    }
    else {
      if (TVar4 == kMemcpy) {
        pcVar17 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)TVar4,1,"+as_tag == +kMemcpy");
      }
      if (pcVar17 != (Nonnull<const_char_*>)0x0) goto LAB_00226d6b;
      if (uVar5 < 0x21) {
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar19);
        uVar21 = *puVar1;
        uVar22 = puVar1[1];
        uVar23 = puVar1[2];
        uVar24 = puVar1[3];
        goto LAB_00226b42;
      }
      if (0x40 < uVar5) {
        if (0x50 < uVar5) {
          lVar15 = (long)mem + 0x50;
          uVar16 = 0x50;
          do {
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar16);
            uVar7 = *puVar3;
            uVar8 = puVar3[1];
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar16);
            uVar9 = *puVar3;
            uVar10 = puVar3[1];
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar16);
            uVar11 = *puVar3;
            uVar12 = puVar3[1];
            puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar16);
            uVar13 = puVar3[1];
            *(undefined8 *)(lVar15 + -0x10) = *puVar3;
            *(undefined8 *)(lVar15 + -8) = uVar13;
            *(undefined8 *)(lVar15 + -0x20) = uVar11;
            *(undefined8 *)(lVar15 + -0x18) = uVar12;
            *(undefined8 *)(lVar15 + -0x30) = uVar9;
            *(undefined8 *)(lVar15 + -0x28) = uVar10;
            *(undefined8 *)(lVar15 + -0x40) = uVar7;
            *(undefined8 *)(lVar15 + -0x38) = uVar8;
            uVar16 = uVar16 + 0x40;
            lVar15 = lVar15 + 0x40;
          } while (uVar16 < uVar19);
        }
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar19);
        uVar21 = *puVar1;
        uVar22 = puVar1[1];
        uVar23 = puVar1[2];
        uVar24 = puVar1[3];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar19);
        uVar7 = *puVar3;
        uVar8 = puVar3[1];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar19);
        uVar9 = *puVar3;
        uVar10 = puVar3[1];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar19);
        uVar11 = puVar3[1];
        puVar2 = (undefined8 *)((long)mem + (uVar19 - 0x10));
        *puVar2 = *puVar3;
        puVar2[1] = uVar11;
        puVar3 = (undefined8 *)((long)mem + (uVar19 - 0x20));
        *puVar3 = uVar9;
        puVar3[1] = uVar10;
        puVar3 = (undefined8 *)((long)mem + (uVar19 - 0x30));
        *puVar3 = uVar7;
        puVar3[1] = uVar8;
        goto LAB_00226c53;
      }
      iVar6 = prototype_for_copy[1]._internal_metadata_.ptr_;
      *(_func_int ***)((long)mem + 0x10) = prototype_for_copy[1]._vptr_MessageLite;
      *(intptr_t *)((long)mem + 0x18) = iVar6;
      puVar1 = (undefined4 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar19);
      uVar21 = *puVar1;
      uVar22 = puVar1[1];
      uVar23 = puVar1[2];
      uVar24 = puVar1[3];
      puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar19);
      uVar7 = puVar3[1];
      puVar2 = (undefined8 *)((long)mem + (uVar19 - 0x10));
      *puVar2 = *puVar3;
      puVar2[1] = uVar7;
LAB_00226b89:
      puVar1 = (undefined4 *)((long)mem + (uVar19 - 0x20));
      *puVar1 = uVar21;
      puVar1[1] = uVar22;
      puVar1[2] = uVar23;
      puVar1[3] = uVar24;
LAB_00226c59:
      arena_bits(this);
      uVar16 = arena_bits(this);
      while( true ) {
        if (uVar16 == 0) {
          iVar6 = (prototype_for_copy->_internal_metadata_).ptr_;
          *(_func_int ***)mem = prototype_for_copy->_vptr_MessageLite;
          *(intptr_t *)((long)mem + 8) = iVar6;
          *(Arena **)((long)mem + 8) = arena;
          return (MessageLite *)mem;
        }
        lVar15 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar20 = (ulong)(uint)((int)lVar15 << 3);
        if (uVar19 < uVar20 + 8) {
          pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              (uVar20 + 8,uVar19,"offset + sizeof(Arena*) <= size");
        }
        else {
          pcVar17 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar17 != (Nonnull<const_char_*>)0x0) break;
        if (*(void **)((long)mem + uVar20) == (void *)0x0) {
          pcVar17 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                              (*(void **)((long)mem + uVar20),(void *)0x0,
                               "*reinterpret_cast<Arena**>(dst + offset) == nullptr");
        }
        if (pcVar17 != (Nonnull<const_char_*>)0x0) goto LAB_00226d47;
        *(Arena **)((long)mem + uVar20) = arena;
        uVar16 = uVar16 & uVar16 - 1;
      }
    }
    PlacementNew<false,google::protobuf::MessageLite>();
  }
  PlacementNew<false,google::protobuf::MessageLite>();
LAB_00226d6b:
  PlacementNew<false,google::protobuf::MessageLite>();
}

Assistant:

PROTOBUF_ALWAYS_INLINE MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || (int8_t)as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}